

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_proxy_has(JSContext *ctx,JSValue obj,JSAtom atom)

{
  JSObject *p;
  JSValueUnion JVar1;
  int iVar2;
  JSProxyData *pJVar3;
  JSValue JVar4;
  JSValue JVar5;
  JSValue method;
  JSPropertyDescriptor desc;
  JSValueUnion local_a0;
  int64_t local_98;
  JSValueUnion local_90 [7];
  JSValueUnion local_58;
  int64_t iStack_50;
  JSValue local_48;
  
  pJVar3 = get_proxy_method(ctx,(JSValue *)&local_a0,obj,99);
  if (pJVar3 == (JSProxyData *)0x0) {
    return -1;
  }
  if ((uint)local_98 == 3) {
    iVar2 = JS_HasProperty(ctx,pJVar3->target,atom);
    return iVar2;
  }
  JVar4 = __JS_AtomToValue(ctx,atom,0);
  local_90[0] = JVar4.u;
  if ((uint)JVar4.tag == 6) {
    local_90[0].float64 = local_a0.float64;
    if ((0xfffffff4 < (uint)local_98) &&
       (iVar2 = *local_a0.ptr, *(int *)local_a0.ptr = iVar2 + -1, iVar2 < 2)) {
      JVar4.tag = local_98;
      JVar4.u.ptr = local_a0.ptr;
      __JS_FreeValueRT(ctx->rt,JVar4);
    }
  }
  else {
    local_58.ptr = *(void **)&(pJVar3->target).u;
    iStack_50 = (pJVar3->target).tag;
    JVar5.tag = local_98;
    JVar5.u.ptr = local_a0.ptr;
    local_48 = JVar4;
    JVar5 = JS_CallFree(ctx,JVar5,pJVar3->handler,2,(JSValue *)&local_58);
    if ((0xfffffff4 < (uint)JVar4.tag) &&
       (iVar2 = *local_90[0].ptr, *(int *)local_90[0].ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar4);
    }
    if ((int)JVar5.tag != 6) {
      iVar2 = JS_ToBoolFree(ctx,JVar5);
      if (iVar2 != 0) {
        return iVar2;
      }
      p = (JSObject *)(pJVar3->target).u.ptr;
      iVar2 = JS_GetOwnPropertyInternal(ctx,(JSPropertyDescriptor *)local_90,p,atom);
      JVar1 = local_90[0];
      if (-1 < iVar2) {
        if (iVar2 == 0) {
          return 0;
        }
        js_free_desc(ctx,(JSPropertyDescriptor *)local_90);
        if ((((ulong)JVar1.ptr & 1) != 0) && (((p->field_0).header.dummy1 & 1) != 0)) {
          return 0;
        }
        JS_ThrowTypeError(ctx,"proxy: inconsistent has");
      }
    }
  }
  return -1;
}

Assistant:

static int js_proxy_has(JSContext *ctx, JSValueConst obj, JSAtom atom)
{
    JSProxyData *s;
    JSValue method, ret1, atom_val;
    int ret, res;
    JSObject *p;
    JSValueConst args[2];
    BOOL res2;

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_has);
    if (!s)
        return -1;
    if (JS_IsUndefined(method))
        return JS_HasProperty(ctx, s->target, atom);
    atom_val = JS_AtomToValue(ctx, atom);
    if (JS_IsException(atom_val)) {
        JS_FreeValue(ctx, method);
        return -1;
    }
    args[0] = s->target;
    args[1] = atom_val;
    ret1 = JS_CallFree(ctx, method, s->handler, 2, args);
    JS_FreeValue(ctx, atom_val);
    if (JS_IsException(ret1))
        return -1;
    ret = JS_ToBoolFree(ctx, ret1);
    if (!ret) {
        JSPropertyDescriptor desc;
        p = JS_VALUE_GET_OBJ(s->target);
        res = JS_GetOwnPropertyInternal(ctx, &desc, p, atom);
        if (res < 0)
            return -1;
        if (res) {
            res2 = !(desc.flags & JS_PROP_CONFIGURABLE);
            js_free_desc(ctx, &desc);
            if (res2 || !p->extensible) {
                JS_ThrowTypeError(ctx, "proxy: inconsistent has");
                return -1;
            }
        }
    }
    return ret;
}